

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O0

BuildValue * __thiscall
llbuild::buildsystem::BuildValue::operator=(BuildValue *this,BuildValue *rhs)

{
  bool bVar1;
  BuildValue *rhs_local;
  BuildValue *this_local;
  
  if (this != rhs) {
    bVar1 = hasMultipleOutputs(this);
    if ((bVar1) && ((this->valueData).asOutputInfos != (FileInfo *)0x0)) {
      operator_delete__((this->valueData).asOutputInfos);
    }
    this->kind = rhs->kind;
    this->numOutputInfos = rhs->numOutputInfos;
    (this->signature).value = (rhs->signature).value;
    bVar1 = hasMultipleOutputs(rhs);
    if (bVar1) {
      (this->valueData).asOutputInfo.device = (rhs->valueData).asOutputInfo.device;
      (rhs->valueData).asOutputInfo.device = 0;
    }
    else {
      memcpy(&this->valueData,&rhs->valueData,0x50);
    }
    bVar1 = kindHasStringList(rhs);
    if (bVar1) {
      llbuild::basic::StringList::operator=(&this->stringValues,&rhs->stringValues);
    }
  }
  return this;
}

Assistant:

BuildValue& operator=(BuildValue&& rhs) {
    if (this != &rhs) {
      // Release our resources.
      if (hasMultipleOutputs())
        delete[] valueData.asOutputInfos;

      // Move the data.
      kind = rhs.kind;
      numOutputInfos = rhs.numOutputInfos;
      signature = rhs.signature;
      if (rhs.hasMultipleOutputs()) {
        valueData.asOutputInfos = rhs.valueData.asOutputInfos;
        rhs.valueData.asOutputInfos = nullptr;
      } else {
        valueData.asOutputInfo = rhs.valueData.asOutputInfo;
      }
      if (rhs.kindHasStringList()) {
        stringValues = std::move(rhs.stringValues);
      }
    }
    return *this;
  }